

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::SelectBinder::BindUnnest
          (BindResult *__return_storage_ptr__,SelectBinder *this,FunctionExpression *function,
          idx_t depth,bool root_expression)

{
  idx_t *piVar1;
  LogicalTypeId LVar2;
  Binder *binder;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  size_type sVar4;
  pointer pcVar5;
  long lVar6;
  ClientContext *pCVar7;
  pointer ppVar8;
  long *plVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  byte bVar12;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var13;
  SelectBinder *this_00;
  optional_idx oVar14;
  bool bVar15;
  int iVar16;
  uint32_t uVar17;
  pointer pOVar18;
  ulong uVar19;
  reference pvVar20;
  pointer pPVar21;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar22;
  type pEVar23;
  type pPVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  pointer pEVar26;
  LogicalType *pLVar27;
  LogicalType *pLVar28;
  BoundUnnestExpression *this_01;
  pointer pBVar29;
  iterator iVar30;
  child_list_t<LogicalType> *pcVar31;
  undefined8 uVar32;
  InvalidInputException *this_02;
  ParameterNotAllowedException *this_03;
  BinderException *pBVar33;
  ParameterNotResolvedException *this_04;
  undefined4 uVar34;
  pointer ppVar35;
  _Alloc_hider _Var36;
  undefined7 in_register_00000081;
  size_type __n;
  long lVar37;
  long lVar38;
  undefined1 auVar39 [8];
  type unnest_expr;
  string alias;
  BoundUnnestNode unnest_node;
  Value value;
  idx_t current_level;
  LogicalType return_type;
  ErrorData error;
  ulong local_3d8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3d0;
  string local_3c8;
  SelectBinder *local_3a8;
  BindResult *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  ulong local_390;
  optional_idx local_388;
  ulong local_380;
  undefined1 local_378 [8];
  undefined8 uStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_358;
  undefined1 local_350 [8];
  undefined1 local_348 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  Val local_330;
  _Alloc_hider local_320;
  char local_310 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_300 [56];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2c0;
  idx_t local_2b8;
  pointer local_2b0;
  LogicalType local_2a8;
  ErrorData local_290;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [128];
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  char local_118 [16];
  _Alloc_hider local_108;
  char local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  __node_base local_d8;
  size_type local_d0;
  _Prime_rehash_policy local_c8;
  __node_base_ptr local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [8];
  
  local_3a0 = __return_storage_ptr__;
  local_2b8 = depth;
  if (depth != 0) {
    local_350 = (undefined1  [8])(local_348 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_350,"UNNEST() for correlated expressions is not supported yet","");
    BinderException::BinderException<>
              ((BinderException *)&local_290,&function->super_ParsedExpression,(string *)local_350);
    BindResult::BindResult(local_3a0,(Exception *)&local_290);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_290);
    _Var36._M_p = (pointer)local_350;
    if (local_350 == (undefined1  [8])(local_348 + 8)) {
      return local_3a0;
    }
    goto LAB_011aab51;
  }
  uVar34 = (undefined4)CONCAT71(in_register_00000081,root_expression);
  local_3a8 = this;
  ErrorData::ErrorData(&local_290);
  if ((function->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (function->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_350 = (undefined1  [8])(local_348 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_350,"UNNEST() requires a single argument","");
    BinderException::BinderException<>
              ((BinderException *)&local_3c8,&function->super_ParsedExpression,(string *)local_350);
    BindResult::BindResult(local_3a0,(Exception *)&local_3c8);
LAB_011ab416:
    ::std::runtime_error::~runtime_error((runtime_error *)&local_3c8);
LAB_011ab420:
    if (local_350 != (undefined1  [8])(local_348 + 8)) {
LAB_011ab42d:
      operator_delete((void *)local_350);
    }
  }
  else if ((local_3a8->super_BaseSelectBinder).inside_window == true) {
    (*(local_3a8->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[0xe])
              (local_350);
    BinderException::BinderException<>
              ((BinderException *)&local_3c8,&function->super_ParsedExpression,(string *)local_350);
    BindResult::BindResult(local_3a0,(Exception *)&local_3c8);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_3c8);
    if (local_350 != (undefined1  [8])(local_348 + 8)) goto LAB_011ab42d;
  }
  else {
    if (((function->distinct != false) ||
        ((function->filter).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
         (ParsedExpression *)0x0)) ||
       (pOVar18 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(&function->order_bys),
       (pOVar18->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pOVar18->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_350 = (undefined1  [8])(local_348 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,
                 "\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not applicable to \"UNNEST\"","");
      InvalidInputException::InvalidInputException(this_02,(string *)local_350);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&function->children;
    uVar19 = (long)(function->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(function->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_3d8 = 1;
    if (uVar19 != 8) {
      if (8 < uVar19) {
        local_390 = CONCAT44(local_390._4_4_,uVar34);
        local_3d8 = 1;
        bVar15 = false;
        local_380 = local_380 & 0xffffffff00000000;
        __n = 1;
        local_398 = paVar25;
        do {
          if (bVar15) {
            local_350 = (undefined1  [8])(local_348 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_350,"UNNEST() only supports a single additional argument","")
            ;
            BinderException::BinderException<>
                      ((BinderException *)&local_3c8,&function->super_ParsedExpression,
                       (string *)local_350);
            BindResult::BindResult(local_3a0,(Exception *)&local_3c8);
            goto LAB_011ab416;
          }
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)paVar25,__n);
          pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar20);
          iVar16 = (*(pPVar21->super_BaseExpression)._vptr_BaseExpression[6])(pPVar21);
          if ((char)iVar16 != '\0') {
            this_03 = (ParameterNotAllowedException *)__cxa_allocate_exception(0x10);
            local_350 = (undefined1  [8])(local_348 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_350,"Parameter not allowed in unnest parameter","");
            ParameterNotAllowedException::ParameterNotAllowedException(this_03,(string *)local_350);
            __cxa_throw(this_03,&ParameterNotAllowedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)paVar25,__n);
          pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar20);
          iVar16 = (*(pPVar21->super_BaseExpression)._vptr_BaseExpression[5])(pPVar21);
          if ((char)iVar16 == '\0') break;
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)paVar25,__n);
          pPVar21 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar20);
          StringUtil::Lower(&local_3c8,&(pPVar21->super_BaseExpression).alias);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)paVar25,__n);
          ExpressionBinder::BindChild((ExpressionBinder *)local_3a8,pvVar20,local_2b8,&local_290);
          if ((runtime_error)local_290.initialized == (runtime_error)0x1) {
            local_1b0[0] = local_290.initialized;
            local_1b0[1] = local_290.type;
            if (local_290.raw_message._M_dataplus._M_p == (pointer)((long)&local_290 + 0x18U)) {
              local_1b0._32_4_ = local_290.raw_message.field_2._8_4_;
              local_1b0._36_4_ = local_290.raw_message.field_2._12_4_;
              local_1b0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_1b0 + 0x18);
            }
            else {
              local_1b0._8_8_ = local_290.raw_message._M_dataplus._M_p;
            }
            local_1b0._28_4_ = local_290.raw_message.field_2._M_allocated_capacity._4_4_;
            local_1b0._24_4_ = local_290.raw_message.field_2._M_allocated_capacity._0_4_;
            local_1b0._16_8_ = local_290.raw_message._M_string_length;
            local_290.raw_message._M_string_length = 0;
            local_290.raw_message.field_2._M_allocated_capacity._0_4_ =
                 local_290.raw_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            if (local_290.final_message._M_dataplus._M_p == (pointer)((long)&local_290 + 0x38U)) {
              local_1b0._64_4_ = local_290.final_message.field_2._8_4_;
              local_1b0._68_4_ = local_290.final_message.field_2._12_4_;
              local_1b0._40_8_ = local_1b0 + 0x38;
            }
            else {
              local_1b0._40_8_ = local_290.final_message._M_dataplus._M_p;
            }
            local_1b0._60_4_ = local_290.final_message.field_2._M_allocated_capacity._4_4_;
            local_1b0._56_4_ = local_290.final_message.field_2._M_allocated_capacity._0_4_;
            local_1b0._48_8_ = local_290.final_message._M_string_length;
            local_290.final_message._M_string_length = 0;
            local_290.final_message.field_2._M_allocated_capacity._0_4_ =
                 local_290.final_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            local_290.raw_message._M_dataplus._M_p = (pointer)((long)&local_290 + 0x18U);
            local_290.final_message._M_dataplus._M_p = (pointer)((long)&local_290 + 0x38U);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(local_1b0 + 0x48),(long)&local_290 + 0x48);
            BindResult::BindResult(local_3a0,(ErrorData *)local_1b0);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_1b0 + 0x48));
            if ((undefined1 *)local_1b0._40_8_ != local_1b0 + 0x38) {
              operator_delete((void *)local_1b0._40_8_);
            }
            iVar16 = 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._8_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1b0 + 0x18)) {
              operator_delete((void *)local_1b0._8_8_);
            }
            bVar15 = false;
            paVar25 = local_398;
          }
          else {
            pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                    *)paVar25,__n);
            pPVar24 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(pvVar20);
            puVar22 = BoundExpression::GetExpression(pPVar24);
            pCVar7 = (local_3a8->super_BaseSelectBinder).super_ExpressionBinder.context;
            pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(puVar22);
            ExpressionExecutor::EvaluateScalar((Value *)local_350,pCVar7,pEVar23,true);
            iVar16 = ::std::__cxx11::string::compare((char *)&local_3c8);
            if (iVar16 == 0) {
              bVar15 = Value::GetValue<bool>((Value *)local_350);
              if (bVar15) {
                local_3d8 = 0xffffffffffffffff;
              }
LAB_011ab12f:
              iVar16 = 0;
              local_380 = CONCAT44(local_380._4_4_,(int)CONCAT71((int7)(local_3d8 >> 8),1));
              bVar15 = true;
            }
            else {
              iVar16 = ::std::__cxx11::string::compare((char *)&local_3c8);
              if (iVar16 == 0) {
                uVar17 = Value::GetValue<unsigned_int>((Value *)local_350);
                if (uVar17 == 0) {
                  pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_378 = (undefined1  [8])&local_368;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_378,"UNNEST cannot have a max depth of 0","");
                  BinderException::BinderException(pBVar33,(string *)local_378);
                  __cxa_throw(pBVar33,&BinderException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                local_3d8 = (ulong)uVar17;
                goto LAB_011ab12f;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_string_length !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
                local_378 = (undefined1  [8])&local_368;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_378,"Unsupported parameter \"%s\" for unnest","");
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1d0,local_3c8._M_dataplus._M_p,
                           (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)(local_3c8._M_string_length + (long)local_3c8._M_dataplus._M_p));
                BinderException::BinderException<std::__cxx11::string>
                          (pBVar33,(string *)local_378,&local_1d0);
                __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              iVar16 = 2;
              bVar15 = false;
            }
            Value::~Value((Value *)local_350);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if (iVar16 != 0) {
            if (iVar16 != 2) goto LAB_011ab432;
            break;
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)(function->children).
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(function->children).
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
        uVar34 = (undefined4)local_390;
        if ((local_380 & 1) != 0) goto LAB_011aaca5;
      }
      local_350 = (undefined1  [8])(local_348 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,
                 "UNNEST - unsupported extra argument, unnest only supports recursive := [true/false] or max_depth := #"
                 ,"");
      BinderException::BinderException<>
                ((BinderException *)&local_3c8,&function->super_ParsedExpression,(string *)local_350
                );
      BindResult::BindResult(local_3a0,(Exception *)&local_3c8);
      goto LAB_011ab416;
    }
LAB_011aaca5:
    this_00 = local_3a8;
    local_390 = CONCAT44(local_390._4_4_,uVar34);
    local_3a8->unnest_level = local_3a8->unnest_level + 1;
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)paVar25,0);
    ExpressionBinder::BindChild((ExpressionBinder *)this_00,pvVar20,local_2b8,&local_290);
    if ((runtime_error)local_290.initialized == (runtime_error)0x1) {
      pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)paVar25,0);
      local_130[0] = local_290.initialized;
      local_130[1] = local_290.type;
      local_128._M_p = local_118;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_290.raw_message._M_dataplus._M_p,
                 (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(local_290.raw_message._M_dataplus._M_p + local_290.raw_message._M_string_length
                    ));
      local_108._M_p = local_f8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_290.final_message._M_dataplus._M_p,
                 local_290.final_message._M_dataplus._M_p + local_290.final_message._M_string_length
                );
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ = local_290.extra_info._M_h._M_bucket_count;
      local_d8._M_nxt = (_Hash_node_base *)0x0;
      local_d0 = local_290.extra_info._M_h._M_element_count;
      local_c8._M_max_load_factor = local_290.extra_info._M_h._M_rehash_policy._M_max_load_factor;
      local_c8._4_4_ = local_290.extra_info._M_h._M_rehash_policy._4_4_;
      local_c8._M_next_resize = local_290.extra_info._M_h._M_rehash_policy._M_next_resize;
      local_b8 = (__node_base_ptr)0x0;
      local_3c8._M_dataplus._M_p = (pointer)&local_e8;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_e8._M_local_buf,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)&local_290 + 0x48),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)&local_3c8);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)local_350,(ExpressionBinder *)local_3a8,pvVar20,
                 (ErrorData *)local_130);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_e8._M_local_buf);
      if (local_108._M_p != local_f8) {
        operator_delete(local_108._M_p);
      }
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
      }
      bVar15 = local_348[0];
      if (local_348[0] == true) {
        ErrorData::ErrorData((ErrorData *)local_b0,(ErrorData *)local_348);
        BindResult::BindResult(local_3a0,(ErrorData *)local_b0);
        ErrorData::~ErrorData((ErrorData *)local_b0);
      }
      else {
        pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)paVar25,0);
        pPVar24 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar20);
        puVar22 = BoundExpression::GetExpression(pPVar24);
        binder = (local_3a8->super_BaseSelectBinder).super_ExpressionBinder.binder;
        pEVar23 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar22);
        ExpressionBinder::ExtractCorrelatedExpressions(binder,pEVar23);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_300);
      if (local_320._M_p != local_310) {
        operator_delete(local_320._M_p);
      }
      if ((Val *)local_340._M_allocated_capacity != &local_330) {
        operator_delete((void *)local_340._M_allocated_capacity);
      }
      if (local_350 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_350 + 8))();
      }
      if (bVar15 != false) goto LAB_011ab432;
    }
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)paVar25,0);
    pPVar24 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar20);
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)BoundExpression::GetExpression(pPVar24);
    pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&paVar25->_M_allocated_capacity);
    piVar1 = &local_3a8->unnest_level;
    *piVar1 = *piVar1 - 1;
    if (*piVar1 != 0) {
      pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
      local_350 = (undefined1  [8])(local_348 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,
                 "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels"
                 ,"");
      BinderException::BinderException<>
                (pBVar33,&function->super_ParsedExpression,(string *)local_350);
      __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pLVar28 = &pEVar26->return_type;
    LVar2 = pLVar28->id_;
    if ((1 < LVar2 - 100) && (LVar2 != SQLNULL)) {
      if (LVar2 == UNKNOWN) {
        this_04 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_04);
        __cxa_throw(this_04,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      local_350 = (undefined1  [8])(local_348 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,
                 "UNNEST() can only be applied to lists, structs and NULL, not %s","");
      LogicalType::ToString_abi_cxx11_(&local_1f0,pLVar28);
      BinderException::BinderException<std::__cxx11::string>
                ((BinderException *)&local_3c8,&function->super_ParsedExpression,(string *)local_350
                 ,&local_1f0);
      BindResult::BindResult(local_3a0,(Exception *)&local_3c8);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      goto LAB_011ab420;
    }
    local_3d0._M_head_impl = (Expression *)paVar25->_M_allocated_capacity;
    paVar25->_M_allocated_capacity = 0;
    if (LVar2 == SQLNULL) {
      lVar37 = 1;
      bVar15 = true;
      local_380 = 0;
LAB_011ab4ac:
      LogicalType::LogicalType(&local_2a8,pLVar28);
      if (lVar37 != 0) {
        do {
          lVar37 = lVar37 + -1;
          if ((local_2a8.id_ == LIST) &&
             (pLVar28 = ListType::GetChildType(&local_2a8), &local_2a8 != pLVar28)) {
            local_2a8.id_ = pLVar28->id_;
            local_2a8.physical_type_ = pLVar28->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&local_2a8.type_info_,&pLVar28->type_info_);
          }
          this_01 = (BoundUnnestExpression *)operator_new(0x60);
          LogicalType::LogicalType((LogicalType *)local_350,&local_2a8);
          BoundUnnestExpression::BoundUnnestExpression(this_01,(LogicalType *)local_350);
          local_388.index = (idx_t)this_01;
          LogicalType::~LogicalType((LogicalType *)local_350);
          pBVar29 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                  *)&local_388);
          _Var13._M_head_impl = local_3d0._M_head_impl;
          local_3d0._M_head_impl = (Expression *)0x0;
          _Var3._M_head_impl =
               (pBVar29->child).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pBVar29->child).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var13._M_head_impl;
          if (_Var3._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          sVar4 = (function->super_ParsedExpression).super_BaseExpression.alias._M_string_length;
          if (sVar4 == 0) {
            pBVar29 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                      ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                    *)&local_388);
            (*(pBVar29->super_Expression).super_BaseExpression._vptr_BaseExpression[8])
                      (&local_3c8,pBVar29);
          }
          else {
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            pcVar5 = (function->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>((string *)&local_3c8,pcVar5,pcVar5 + sVar4);
          }
          local_2b0 = (pointer)(local_3a8->unnest_level + lVar37);
          iVar30 = ::std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(((local_3a8->super_BaseSelectBinder).node)->unnests)._M_h,
                          (key_type *)&local_2b0);
          oVar14.index = local_388.index;
          if (iVar30.
              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
              ._M_cur == (__node_type *)0x0) {
            uStack_370 = (Val *)0x0;
            local_368._M_allocated_capacity = 0;
            local_368._8_8_ = 0;
            local_378 = (undefined1  [8])
                        Binder::GenerateTableIndex
                                  ((local_3a8->super_BaseSelectBinder).super_ExpressionBinder.binder
                                  );
            local_350 = (undefined1  [8])local_388.index;
            local_388.index = 0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&uStack_370,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_350);
            if (local_350 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_350 + 8))();
            }
            auVar39 = local_378;
            local_350 = (undefined1  [8])local_2b0;
            local_348 = local_378;
            local_340._M_allocated_capacity = (size_type)uStack_370;
            local_340._8_8_ = local_368._M_allocated_capacity;
            local_330.bigint = local_368._8_8_;
            uStack_370 = (Val *)0x0;
            local_368._M_allocated_capacity = 0;
            local_368._8_8_ = 0;
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::BoundUnnestNode>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,duckdb::BoundUnnestNode>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::BoundUnnestNode>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&((local_3a8->super_BaseSelectBinder).node)->unnests,
                       (LogicalType *)local_350);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)(local_348 + 8));
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)&uStack_370);
            local_348 = (undefined1  [8])0x0;
          }
          else {
            auVar39 = *(undefined1 (*) [8])
                       ((long)iVar30.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                              ._M_cur + 0x10);
            lVar38 = *(long *)((long)iVar30.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                     ._M_cur + 0x20);
            lVar6 = *(long *)((long)iVar30.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                    ._M_cur + 0x18);
            local_388.index = 0;
            local_350 = (undefined1  [8])oVar14.index;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)((long)iVar30.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                                 ._M_cur + 0x18),
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_350);
            if (local_350 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_350 + 8))();
            }
            local_348 = (undefined1  [8])(lVar38 - lVar6 >> 3);
          }
          local_350 = auVar39;
          make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
                    ((duckdb *)local_378,&local_3c8,&local_2a8,(ColumnBinding *)local_350,&local_2b8
                    );
          auVar39 = local_378;
          _Var3._M_head_impl = local_3d0._M_head_impl;
          local_378 = (undefined1  [8])0x0;
          local_3d0._M_head_impl = (Expression *)auVar39;
          if ((_Var3._M_head_impl != (Expression *)0x0) &&
             ((*((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
             local_378 != (undefined1  [8])0x0)) {
            (**(code **)(*(size_type *)local_378 + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if ((long *)local_388.index != (long *)0x0) {
            (**(code **)(*(long *)local_388.index + 8))();
          }
        } while (lVar37 != 0);
      }
      if (!bVar15) {
        local_3c8._M_dataplus._M_p = (pointer)0x0;
        local_3c8._M_string_length = 0;
        local_3c8.field_2._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_3c8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_3d0);
        if (local_380 != 0) {
          uVar19 = 0;
          do {
            local_378._0_4_ = 0;
            local_378._4_4_ = 0;
            uStack_370._0_4_ = 0;
            uStack_370._4_4_ = 0;
            local_378 = (undefined1  [8])0x0;
            uStack_370 = (Val *)0x0;
            local_368._M_allocated_capacity = 0;
            if (local_3c8._M_dataplus._M_p == (pointer)local_3c8._M_string_length) {
              bVar15 = true;
              uVar32 = (Val *)0x0;
              local_348 = (undefined1  [8])local_3c8._M_string_length;
              local_350 = (undefined1  [8])local_3c8._M_dataplus._M_p;
            }
            else {
              bVar12 = 0;
              local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3c8._M_string_length;
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8._M_string_length;
              _Var36._M_p = local_3c8._M_dataplus._M_p;
              local_390 = uVar19;
              do {
                pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)_Var36._M_p);
                if ((pEVar26->return_type).id_ == STRUCT) {
                  pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                          *)_Var36._M_p);
                  pcVar31 = StructType::GetChildTypes_abi_cxx11_(&pEVar26->return_type);
                  pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                          *)_Var36._M_p);
                  bVar15 = StructType::IsUnnamed(&pEVar26->return_type);
                  if (bVar15) {
                    if ((pcVar31->
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        (pcVar31->
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      uVar19 = 0;
                      do {
                        pCVar7 = (local_3a8->super_BaseSelectBinder).super_ExpressionBinder.context;
                        pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                                *)_Var36._M_p);
                        (*(pEVar26->super_BaseExpression)._vptr_BaseExpression[0x11])
                                  (&local_2c0,pEVar26);
                        uVar19 = uVar19 + 1;
                        CreateBoundStructExtractIndex
                                  ((duckdb *)local_350,pCVar7,
                                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)&local_2c0,uVar19);
                        ::std::
                        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        ::
                        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                    *)local_378,
                                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)local_350);
                        if (local_350 != (undefined1  [8])0x0) {
                          (**(code **)(*(size_type *)local_350 + 8))();
                        }
                        local_350 = (undefined1  [8])0x0;
                        if (local_2c0._M_head_impl != (Expression *)0x0) {
                          (*((local_2c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1]
                          )();
                        }
                        local_2c0._M_head_impl = (Expression *)0x0;
                      } while (uVar19 < (ulong)(((long)(pcVar31->
                                                                                                              
                                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ).
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(pcVar31->
                                                                                                              
                                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ).
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                               0x6db6db6db6db6db7));
                    }
                  }
                  else {
                    ppVar8 = (pcVar31->
                             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             ).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    for (ppVar35 = (pcVar31->
                                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                   ).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start; ppVar35 != ppVar8;
                        ppVar35 = ppVar35 + 1) {
                      pCVar7 = (local_3a8->super_BaseSelectBinder).super_ExpressionBinder.context;
                      pEVar26 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                              *)_Var36._M_p);
                      (*(pEVar26->super_BaseExpression)._vptr_BaseExpression[0x11])
                                (&local_358,pEVar26);
                      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                      pcVar5 = (ppVar35->first)._M_dataplus._M_p;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_210,pcVar5,
                                 pcVar5 + (ppVar35->first)._M_string_length);
                      CreateBoundStructExtract
                                ((duckdb *)local_350,pCVar7,
                                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  *)&local_358,&local_210);
                      ::std::
                      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      ::
                      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                  *)local_378,
                                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  *)local_350);
                      if (local_350 != (undefined1  [8])0x0) {
                        (**(code **)(*(size_type *)local_350 + 8))();
                      }
                      local_350 = (undefined1  [8])0x0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_210._M_dataplus._M_p != &local_210.field_2) {
                        operator_delete(local_210._M_dataplus._M_p);
                      }
                      if (local_358._M_head_impl != (Expression *)0x0) {
                        (*((local_358._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])
                                  ();
                      }
                      local_358._M_head_impl = (Expression *)0x0;
                    }
                  }
                  bVar12 = 1;
                  uVar19 = local_390;
                  paVar25 = local_398;
                }
                else {
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                              *)local_378,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)_Var36._M_p);
                }
                _Var36._M_p = _Var36._M_p + 8;
              } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Var36._M_p != paVar25);
              bVar15 = (bool)(bVar12 ^ 1);
              uVar32 = local_368._M_allocated_capacity;
              local_348 = (undefined1  [8])local_3c8._M_string_length;
              local_350 = (undefined1  [8])local_3c8._M_dataplus._M_p;
            }
            local_3c8._M_dataplus._M_p._4_4_ = local_378._4_4_;
            local_3c8._M_dataplus._M_p._0_4_ = local_378._0_4_;
            local_3c8._M_string_length = CONCAT44(uStack_370._4_4_,(undefined4)uStack_370);
            local_340._M_allocated_capacity = local_3c8.field_2._M_allocated_capacity;
            local_378 = (undefined1  [8])0x0;
            uStack_370 = (Val *)0x0;
            local_368._M_allocated_capacity = 0;
            local_3c8.field_2._M_allocated_capacity = uVar32;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)local_350);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)local_378);
          } while ((!bVar15) && (uVar19 = uVar19 + 1, uVar19 != local_380));
        }
        make_uniq<duckdb::BoundExpandedExpression,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                  ((duckdb *)local_350,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)&local_3c8);
        auVar39 = local_350;
        _Var3._M_head_impl = local_3d0._M_head_impl;
        local_350 = (undefined1  [8])0x0;
        local_3d0._M_head_impl = (Expression *)auVar39;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var3._M_head_impl !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           ((**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&(_Var3._M_head_impl)->super_BaseExpression)->_M_allocated_capacity + 8
                        ))(), local_350 != (undefined1  [8])0x0)) {
          (**(code **)(*(size_type *)local_350 + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_3c8);
      }
      local_2c8._M_head_impl = local_3d0._M_head_impl;
      local_3d0._M_head_impl = (Expression *)0x0;
      BindResult::BindResult
                (local_3a0,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(local_2c8._M_head_impl)->super_BaseExpression)->_M_allocated_capacity + 8
                    ))();
      }
      local_2c8._M_head_impl = (Expression *)0x0;
      LogicalType::~LogicalType(&local_2a8);
    }
    else {
      local_398 = paVar25;
      LogicalType::LogicalType((LogicalType *)local_350,pLVar28);
      lVar38 = local_3d8 + (local_3d8 == 0);
      lVar37 = 0;
      do {
        if (local_350[0] != (string)0x65) goto LAB_011ab475;
        pLVar27 = ListType::GetChildType((LogicalType *)local_350);
        auVar39 = local_350;
        if ((LogicalType *)local_350 != pLVar27) {
          uVar10 = pLVar27->id_;
          uVar11 = pLVar27->physical_type_;
          local_350[1] = uVar11;
          local_350[0] = (string)uVar10;
          local_350._2_6_ = auVar39._2_6_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_348,&pLVar27->type_info_);
        }
        lVar37 = lVar37 + 1;
      } while (lVar38 != lVar37);
      lVar37 = lVar38;
LAB_011ab475:
      uVar19 = 0;
      if (local_350[0] == (string)0x64) {
        uVar19 = local_3d8 - lVar37;
      }
      LogicalType::~LogicalType((LogicalType *)local_350);
      _Var3._M_head_impl = local_3d0._M_head_impl;
      bVar15 = uVar19 == 0;
      local_380 = uVar19;
      if ((char)local_390 != '\0' || bVar15) goto LAB_011ab4ac;
      local_3d0._M_head_impl = (Expression *)0x0;
      plVar9 = (long *)local_398->_M_allocated_capacity;
      local_398->_M_allocated_capacity = (size_type)_Var3._M_head_impl;
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 8))();
      }
      local_350 = (undefined1  [8])(local_348 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,
                 "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"
                 ,"");
      BinderException::BinderException<>
                ((BinderException *)&local_3c8,&function->super_ParsedExpression,(string *)local_350
                );
      BindResult::BindResult(local_3a0,(Exception *)&local_3c8);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_3c8);
      if (local_350 != (undefined1  [8])(local_348 + 8)) {
        operator_delete((void *)local_350);
      }
    }
    if (local_3d0._M_head_impl != (Expression *)0x0) {
      (*((local_3d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
LAB_011ab432:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&local_290 + 0x48));
  if (local_290.final_message._M_dataplus._M_p != (pointer)((long)&local_290 + 0x38U)) {
    operator_delete(local_290.final_message._M_dataplus._M_p);
  }
  _Var36._M_p = local_290.raw_message._M_dataplus._M_p;
  if (local_290.raw_message._M_dataplus._M_p == (pointer)((long)&local_290 + 0x18U)) {
    return local_3a0;
  }
LAB_011aab51:
  operator_delete(_Var36._M_p);
  return local_3a0;
}

Assistant:

BindResult SelectBinder::BindUnnest(FunctionExpression &function, idx_t depth, bool root_expression) {
	// bind the children of the function expression
	if (depth > 0) {
		return BindResult(BinderException(function, "UNNEST() for correlated expressions is not supported yet"));
	}

	ErrorData error;
	if (function.children.empty()) {
		return BindResult(BinderException(function, "UNNEST() requires a single argument"));
	}
	if (inside_window) {
		return BindResult(BinderException(function, UnsupportedUnnestMessage()));
	}

	if (function.distinct || function.filter || !function.order_bys->orders.empty()) {
		throw InvalidInputException("\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not "
		                            "applicable to \"UNNEST\"");
	}

	idx_t max_depth = 1;
	if (function.children.size() != 1) {
		bool has_parameter = false;
		bool supported_argument = false;
		for (idx_t i = 1; i < function.children.size(); i++) {
			if (has_parameter) {
				return BindResult(BinderException(function, "UNNEST() only supports a single additional argument"));
			}
			if (function.children[i]->HasParameter()) {
				throw ParameterNotAllowedException("Parameter not allowed in unnest parameter");
			}
			if (!function.children[i]->IsScalar()) {
				break;
			}
			auto alias = StringUtil::Lower(function.children[i]->GetAlias());
			BindChild(function.children[i], depth, error);
			if (error.HasError()) {
				return BindResult(std::move(error));
			}
			auto &const_child = BoundExpression::GetExpression(*function.children[i]);
			auto value = ExpressionExecutor::EvaluateScalar(context, *const_child, true);
			if (alias == "recursive") {
				auto recursive = value.GetValue<bool>();
				if (recursive) {
					max_depth = NumericLimits<idx_t>::Maximum();
				}
			} else if (alias == "max_depth") {
				max_depth = value.GetValue<uint32_t>();
				if (max_depth == 0) {
					throw BinderException("UNNEST cannot have a max depth of 0");
				}
			} else if (!alias.empty()) {
				throw BinderException("Unsupported parameter \"%s\" for unnest", alias);
			} else {
				break;
			}
			has_parameter = true;
			supported_argument = true;
		}
		if (!supported_argument) {
			return BindResult(BinderException(function, "UNNEST - unsupported extra argument, unnest only supports "
			                                            "recursive := [true/false] or max_depth := #"));
		}
	}
	unnest_level++;
	BindChild(function.children[0], depth, error);
	if (error.HasError()) {
		// failed to bind
		// try to bind correlated columns manually
		auto result = BindCorrelatedColumns(function.children[0], error);
		if (result.HasError()) {
			return BindResult(result.error);
		}
		auto &bound_expr = BoundExpression::GetExpression(*function.children[0]);
		ExtractCorrelatedExpressions(binder, *bound_expr);
	}
	auto &child = BoundExpression::GetExpression(*function.children[0]);
	auto &child_type = child->return_type;
	unnest_level--;

	if (unnest_level > 0) {
		throw BinderException(
		    function,
		    "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels");
	}

	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::LIST:
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::SQLNULL:
		break;
	default:
		return BindResult(BinderException(function, "UNNEST() can only be applied to lists, structs and NULL, not %s",
		                                  child_type.ToString()));
	}

	idx_t list_unnests;
	idx_t struct_unnests = 0;

	auto unnest_expr = std::move(child);
	if (child_type.id() == LogicalTypeId::SQLNULL) {
		list_unnests = 1;
	} else {
		// perform all LIST unnests
		auto type = child_type;
		list_unnests = 0;
		while (type.id() == LogicalTypeId::LIST) {
			type = ListType::GetChildType(type);
			list_unnests++;
			if (list_unnests >= max_depth) {
				break;
			}
		}
		// unnest structs
		if (type.id() == LogicalTypeId::STRUCT) {
			struct_unnests = max_depth - list_unnests;
		}
	}
	if (struct_unnests > 0 && !root_expression) {
		child = std::move(unnest_expr);
		return BindResult(BinderException(
		    function, "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"));
	}
	// perform all LIST unnests
	auto return_type = child_type;
	for (idx_t current_depth = 0; current_depth < list_unnests; current_depth++) {
		if (return_type.id() == LogicalTypeId::LIST) {
			return_type = ListType::GetChildType(return_type);
		}
		auto result = make_uniq<BoundUnnestExpression>(return_type);
		result->child = std::move(unnest_expr);
		auto alias = function.GetAlias().empty() ? result->ToString() : function.GetAlias();

		auto current_level = unnest_level + list_unnests - current_depth - 1;
		auto entry = node.unnests.find(current_level);
		idx_t unnest_table_index;
		idx_t unnest_column_index;
		if (entry == node.unnests.end()) {
			BoundUnnestNode unnest_node;
			unnest_node.index = binder.GenerateTableIndex();
			unnest_node.expressions.push_back(std::move(result));
			unnest_table_index = unnest_node.index;
			unnest_column_index = 0;
			node.unnests.insert(make_pair(current_level, std::move(unnest_node)));
		} else {
			unnest_table_index = entry->second.index;
			unnest_column_index = entry->second.expressions.size();
			entry->second.expressions.push_back(std::move(result));
		}
		// now create a column reference referring to the unnest
		unnest_expr = make_uniq<BoundColumnRefExpression>(
		    std::move(alias), return_type, ColumnBinding(unnest_table_index, unnest_column_index), depth);
	}
	// now perform struct unnests, if any
	if (struct_unnests > 0) {
		vector<unique_ptr<Expression>> struct_expressions;
		struct_expressions.push_back(std::move(unnest_expr));

		for (idx_t i = 0; i < struct_unnests; i++) {
			vector<unique_ptr<Expression>> new_expressions;
			// check if there are any structs left
			bool has_structs = false;
			for (auto &expr : struct_expressions) {
				if (expr->return_type.id() == LogicalTypeId::STRUCT) {
					// struct! push a struct_extract
					auto &child_types = StructType::GetChildTypes(expr->return_type);
					if (StructType::IsUnnamed(expr->return_type)) {
						for (idx_t child_index = 0; child_index < child_types.size(); child_index++) {
							new_expressions.push_back(
							    CreateBoundStructExtractIndex(context, expr->Copy(), child_index + 1));
						}
					} else {
						for (auto &entry : child_types) {
							new_expressions.push_back(CreateBoundStructExtract(context, expr->Copy(), entry.first));
						}
					}
					has_structs = true;
				} else {
					// not a struct - push as-is
					new_expressions.push_back(std::move(expr));
				}
			}
			struct_expressions = std::move(new_expressions);
			if (!has_structs) {
				break;
			}
		}
		unnest_expr = make_uniq<BoundExpandedExpression>(std::move(struct_expressions));
	}
	return BindResult(std::move(unnest_expr));
}